

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::setTilesGraphic(Fifteen *this)

{
  unsigned_long uVar1;
  QSize this_00;
  bool bVar2;
  uint uVar3;
  pointer pCVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_t sVar5;
  pointer this_02;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *this_03;
  reference this_04;
  reference puVar6;
  const_reference pvVar7;
  pointer pQVar8;
  unique_ptr<Controller,_std::default_delete<Controller>_> *this_05;
  QString local_c0;
  QFlags<Qt::ImageConversionFlag> local_a4;
  QPixmap local_a0 [8];
  QPixmap pixmap;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *tile;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *__range1;
  QIcon icon;
  NumberColor numberColor;
  int fontSizeInt;
  QSize iconSize;
  vector<QImage,_std::allocator<QImage>_> *images;
  const_iterator value;
  type *tileSizeInt;
  type *boardSizeInt;
  unique_ptr<UndoMove,_std::default_delete<UndoMove>_> local_10;
  Fifteen *this_local;
  
  this_05 = &this->controller;
  local_10._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl =
       (__uniq_ptr_data<UndoMove,_std::default_delete<UndoMove>,_true,_true>)
       (__uniq_ptr_data<UndoMove,_std::default_delete<UndoMove>,_true,_true>)this;
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(this_05);
  Controller::getBoardAttributes((Controller *)&boardSizeInt);
  std::get<0ul,unsigned_long,unsigned_long>((tuple<unsigned_long,_unsigned_long> *)&boardSizeInt);
  value._M_current =
       std::get<1ul,unsigned_long,unsigned_long>
                 ((tuple<unsigned_long,_unsigned_long> *)&boardSizeInt);
  pCVar4 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(this_05);
  this_01 = Controller::getValues(pCVar4);
  images = (vector<QImage,_std::allocator<QImage>_> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
  pCVar4 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(this_05);
  iconSize = (QSize)Controller::getImages(pCVar4);
  QSize::QSize((QSize *)&numberColor,(int)*value._M_current,(int)*value._M_current);
  pCVar4 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(this_05);
  sVar5 = Controller::getFontSize(pCVar4);
  _icon = Options::getNumberOnImageColor();
  QIcon::QIcon((QIcon *)&__range1);
  this_02 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  this_03 = TilesBoard::getTiles(this_02);
  __end1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::begin(this_03);
  tile = (unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *)
         std::
         vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
         ::end(this_03);
  do {
    bVar2 = __gnu_cxx::
            operator==<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                                *)&tile);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      QIcon::~QIcon((QIcon *)&__range1);
      return;
    }
    this_04 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
              ::operator*(&__end1);
    this_00 = iconSize;
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&images);
    pvVar7 = std::vector<QImage,_std::allocator<QImage>_>::at
                       ((vector<QImage,_std::allocator<QImage>_> *)this_00,*puVar6);
    QFlags<Qt::ImageConversionFlag>::QFlags(&local_a4,AutoColor);
    QPixmap::fromImage((QImage *)local_a0,(QFlags_conflict *)pvVar7);
    if (_icon == NO) {
LAB_001176ab:
      QIcon::addPixmap(&__range1,local_a0,0,1);
    }
    else {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&images);
      uVar1 = *puVar6;
      pCVar4 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                         (&this->controller);
      uVar3 = Controller::getNullValue(pCVar4);
      if (uVar1 == uVar3) goto LAB_001176ab;
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&images);
      drawNumberOnTile(this,(QIcon *)&__range1,local_a0,(long)(int)sVar5,*puVar6,_icon);
    }
    pQVar8 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(this_04);
    QAbstractButton::setIconSize((QSize *)pQVar8);
    pQVar8 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(this_04);
    QAbstractButton::setIcon((QIcon *)pQVar8);
    pQVar8 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(this_04);
    QString::QString(&local_c0,"");
    QWidget::setStyleSheet((QString *)pQVar8);
    QString::~QString(&local_c0);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&images,0);
    QPixmap::~QPixmap(local_a0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Fifteen::setTilesGraphic()
{
    const auto [ boardSizeInt, tileSizeInt ] = controller->getBoardAttributes();
    auto value = controller->getValues().begin();

    const auto& images = controller->getImages();
    QSize iconSize( tileSizeInt, tileSizeInt );

    int fontSizeInt = controller->getFontSize();
    NumberColor numberColor = Options::getNumberOnImageColor();
    QIcon icon;

    for ( auto& tile : tilesBoard->getTiles() )
    {
        QPixmap pixmap = QPixmap::fromImage( images.at( *value ));
        if ( numberColor == NumberColor::NO || *value == controller->getNullValue() )
        {
            icon.addPixmap( pixmap );
        }
        else
        {
            drawNumberOnTile( icon, pixmap, fontSizeInt, *value, numberColor );
        }
        tile->setIconSize( iconSize );
        tile->setIcon( icon );
        tile->setStyleSheet( "" );
        value++;
    }
}